

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemnobs.c
# Opt level: O0

size_t jpeg_mem_available(j_common_ptr cinfo,size_t min_bytes_needed,size_t max_bytes_needed,
                         size_t already_allocated)

{
  size_t already_allocated_local;
  size_t max_bytes_needed_local;
  size_t min_bytes_needed_local;
  j_common_ptr cinfo_local;
  size_t local_8;
  
  local_8 = max_bytes_needed;
  if (cinfo->mem->max_memory_to_use != 0) {
    if (already_allocated < (ulong)cinfo->mem->max_memory_to_use) {
      local_8 = cinfo->mem->max_memory_to_use - already_allocated;
    }
    else {
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

GLOBAL(size_t)
jpeg_mem_available(j_common_ptr cinfo, size_t min_bytes_needed,
                   size_t max_bytes_needed, size_t already_allocated)
{
  if (cinfo->mem->max_memory_to_use) {
    if ((size_t)cinfo->mem->max_memory_to_use > already_allocated)
      return cinfo->mem->max_memory_to_use - already_allocated;
    else
      return 0;
  } else {
    /* Here we always say, "we got all you want bud!" */
    return max_bytes_needed;
  }
}